

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O1

void __thiscall QAbstractAnimation::~QAbstractAnimation(QAbstractAnimation *this)

{
  QUntypedPropertyData *data;
  QBindingStorage *this_00;
  int iVar1;
  long lVar2;
  long in_FS_OFFSET;
  QAbstractAnimation *in_stack_ffffffffffffffa8;
  int local_50;
  undefined4 local_4c;
  void *local_48;
  undefined4 *puStack_40;
  int *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_006ae218;
  lVar2 = *(long *)(this + 8);
  data = (QUntypedPropertyData *)(lVar2 + 0x78);
  this_00 = (QBindingStorage *)(lVar2 + 0x40);
  if ((*(long **)(lVar2 + 0x48) != (long *)0x0) && (**(long **)(lVar2 + 0x48) != 0)) {
    QBindingStorage::registerDependency_helper(this_00,data);
  }
  if (*(int *)data != 0) {
    if ((*(long **)(lVar2 + 0x48) != (long *)0x0) && (**(long **)(lVar2 + 0x48) != 0)) {
      QBindingStorage::registerDependency_helper(this_00,data);
    }
    iVar1 = *(int *)data;
    QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
    ::setValue((QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
                *)data,Stopped);
    QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
    ::notify((QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
              *)data);
    if ((*(long **)(lVar2 + 0x48) != (long *)0x0) && (**(long **)(lVar2 + 0x48) != 0)) {
      QBindingStorage::registerDependency_helper(this_00,data);
    }
    local_4c = *(undefined4 *)data;
    puStack_40 = &local_4c;
    local_38 = &local_50;
    local_48 = (void *)0x0;
    local_50 = iVar1;
    QMetaObject::activate((QObject *)this,&staticMetaObject,1,&local_48);
    if (iVar1 == 2) {
      QAnimationTimer::unregisterAnimation(in_stack_ffffffffffffffa8);
    }
  }
  if (*(QAnimationGroup **)(lVar2 + 0x98) != (QAnimationGroup *)0x0) {
    QAnimationGroup::removeAnimation(*(QAnimationGroup **)(lVar2 + 0x98),(QAbstractAnimation *)this)
    ;
  }
  QObject::~QObject((QObject *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractAnimation::~QAbstractAnimation()
{
    Q_D(QAbstractAnimation);
    //we can't call stop here. Otherwise we get pure virtual calls
    if (d->state != Stopped) {
        QAbstractAnimation::State oldState = d->state;
        d->state = Stopped;
        d->state.notify();
        emit stateChanged(d->state, oldState);
        if (oldState == QAbstractAnimation::Running)
            QAnimationTimer::unregisterAnimation(this);
    }
    if (d->group)
        d->group->removeAnimation(this);
}